

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamXYZ.cpp
# Opt level: O3

void __thiscall
OpenMD::TetrahedralityParamXYZ::TetrahedralityParamXYZ
          (TetrahedralityParamXYZ *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType rCut,RealType voxelSize,RealType gaussWidth)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_02;
  Vector3i *pVVar1;
  uint uVar2;
  pointer pcVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Mat3x3d hmat;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  string local_98;
  Mat3x3d local_78;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__TetrahedralityParamXYZ_00337a30;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar3 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar3,pcVar3 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  pcVar3 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript2_,pcVar3,pcVar3 + sele2->_M_string_length);
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->rCut_ = rCut;
  this->voxelSize_ = voxelSize;
  this->gaussWidth_ = gaussWidth;
  (this->nBins_).super_Vector<int,_3U>.data_[0] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[1] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[2] = 0;
  this_02 = &this->hist_;
  (this->count_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->count_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->count_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hist_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hist_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hist_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_78,this_00);
    lVar12 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar12),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] + lVar12));
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_78);
  }
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_78,this_01);
    lVar12 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar12),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] + lVar12));
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_78);
  }
  Snapshot::getHmat(&local_78,info->sman_->currentSnapshot_);
  auVar14._8_8_ =
       local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  auVar14._0_8_ =
       local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  auVar15._8_8_ = voxelSize;
  auVar15._0_8_ = voxelSize;
  auVar15 = divpd(auVar14,auVar15);
  *(ulong *)(this->nBins_).super_Vector<int,_3U>.data_ =
       CONCAT44((int)auVar15._8_8_,(int)auVar15._0_8_);
  (this->nBins_).super_Vector<int,_3U>.data_[2] =
       (int)(local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] /
            voxelSize);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_02,(long)(int)auVar15._0_8_);
  pVVar1 = &this->nBins_;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->count_,(long)(pVVar1->super_Vector<int,_3U>).data_[0]);
  if (0 < (pVVar1->super_Vector<int,_3U>).data_[0]) {
    uVar7 = (ulong)(uint)(this->nBins_).super_Vector<int,_3U>.data_[1];
    lVar12 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this_02->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar12,(long)(int)uVar7);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->count_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12,
               (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
      uVar2 = (this->nBins_).super_Vector<int,_3U>.data_[1];
      uVar7 = (ulong)uVar2;
      if (0 < (int)uVar2) {
        lVar11 = *(long *)&(this_02->
                           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar12].
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar13 = 0;
        lVar10 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)(lVar11 + lVar13),
                     (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(this->count_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar13),
                     (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          lVar11 = *(long *)&(this_02->
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar12].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          pvVar4 = *(void **)(lVar11 + lVar13);
          pvVar5 = *(void **)(lVar11 + 8 + lVar13);
          if (pvVar4 != pvVar5) {
            memset(pvVar4,0,((long)pvVar5 + (-8 - (long)pvVar4) & 0xfffffffffffffff8U) + 8);
          }
          lVar6 = *(long *)&(this->count_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pvVar4 = *(void **)(lVar6 + lVar13);
          pvVar5 = *(void **)(lVar6 + 8 + lVar13);
          if (pvVar4 != pvVar5) {
            memset(pvVar4,0,((long)pvVar5 + (-8 - (long)pvVar4) & 0xfffffffffffffff8U) + 8);
          }
          lVar10 = lVar10 + 1;
          uVar7 = (ulong)(this->nBins_).super_Vector<int,_3U>.data_[1];
          lVar13 = lVar13 + 0x18;
        } while (lVar10 < (long)uVar7);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pVVar1->super_Vector<int,_3U>).data_[0]);
  }
  getPrefix(&local_98,filename);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_a8 = *plVar9;
    lStack_a0 = plVar8[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar9;
    local_b8 = (long *)*plVar8;
  }
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TetrahedralityParamXYZ::TetrahedralityParamXYZ(
      SimInfo* info, const std::string& filename, const std::string& sele1,
      const std::string& sele2, RealType rCut, RealType voxelSize,
      RealType gaussWidth) :
      StaticAnalyser(info, filename, 1),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info), rCut_(rCut),
      voxelSize_(voxelSize), gaussWidth_(gaussWidth) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    Mat3x3d hmat = info->getSnapshotManager()->getCurrentSnapshot()->getHmat();

    nBins_(0) = int(hmat(0, 0) / voxelSize);
    nBins_(1) = int(hmat(1, 1) / voxelSize);
    nBins_(2) = int(hmat(2, 2) / voxelSize);

    hist_.resize(nBins_(0));
    count_.resize(nBins_(0));
    for (int i = 0; i < nBins_(0); ++i) {
      hist_[i].resize(nBins_(1));
      count_[i].resize(nBins_(1));
      for (int j = 0; j < nBins_(1); ++j) {
        hist_[i][j].resize(nBins_(2));
        count_[i][j].resize(nBins_(2));
        std::fill(hist_[i][j].begin(), hist_[i][j].end(), 0.0);
        std::fill(count_[i][j].begin(), count_[i][j].end(), 0.0);
      }
    }

    setOutputName(getPrefix(filename) + ".Qxyz");
  }